

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O1

vector<CAddress,_std::allocator<CAddress>_> *
ReadAnchors(vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,
           path *anchors_db_path)

{
  string_view source_file;
  undefined1 auVar1 [16];
  bool bVar2;
  CChainParams *pCVar3;
  Logger *pLVar4;
  runtime_error *this;
  size_t in_RCX;
  size_t __nbytes;
  code *pcVar5;
  pointer_____offset_0x10___ *ppuVar6;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_R8;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  string_view str;
  string_view logging_function;
  HashVerifier<AutoFile> verifier;
  MessageStartChars pchMsgTmp;
  uint256 hashTmp;
  long local_188 [2];
  string *local_178;
  undefined2 local_170;
  long *local_168 [2];
  long local_158 [2];
  HashVerifier<AutoFile> local_148;
  _Type local_b8 [8];
  undefined1 local_98 [24];
  pointer local_80;
  string local_78;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._0_8_ = fsbridge::fopen((char *)anchors_db_path,"rb");
  local_98._8_16_ = (undefined1  [16])0x0;
  local_80 = (pointer)0x0;
  if ((FILE *)local_98._0_8_ == (FILE *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this = &PTR__exception_013db5e0;
    pcVar5 = std::exception::~exception;
    ppuVar6 = &(anonymous_namespace)::DbNotFoundError::typeinfo;
  }
  else {
    CSHA256::CSHA256((CSHA256 *)&local_148);
    local_148.m_source = (AutoFile *)local_98;
    AutoFile::read(local_148.m_source,(int)local_b8,(void *)0x4,in_RCX);
    CSHA256::Write((CSHA256 *)&local_148,local_b8[0],4);
    pCVar3 = Params();
    __nbytes = (size_t)(uint)local_b8[0];
    if (local_b8[0] == *&(pCVar3->pchMessageStart)._M_elems) {
      local_58._8_8_ = &local_148;
      local_58._0_8_ = &CAddress::V2_DISK;
      VectorFormatter<DefaultFormatter>::
      Unser<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,std::vector<CAddress,std::allocator<CAddress>>>
                ((VectorFormatter<DefaultFormatter> *)&local_78,
                 (ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)local_58,
                 __return_storage_ptr__);
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )0x0;
      local_58._0_8_ = (SerParams *)0x0;
      local_58._8_8_ = (HashVerifier<AutoFile> *)0x0;
      AutoFile::read((AutoFile *)local_98,(int)local_58,(void *)0x20,__nbytes);
      HashWriter::GetHash((uint256 *)&local_78,&local_148.super_HashWriter);
      auVar8[0] = -(local_78.field_2._M_local_buf[0] == local_48._M_local_buf[0]);
      auVar8[1] = -(local_78.field_2._M_local_buf[1] == local_48._M_local_buf[1]);
      auVar8[2] = -(local_78.field_2._M_local_buf[2] == local_48._M_local_buf[2]);
      auVar8[3] = -(local_78.field_2._M_local_buf[3] == local_48._M_local_buf[3]);
      auVar8[4] = -(local_78.field_2._M_local_buf[4] == local_48._M_local_buf[4]);
      auVar8[5] = -(local_78.field_2._M_local_buf[5] == local_48._M_local_buf[5]);
      auVar8[6] = -(local_78.field_2._M_local_buf[6] == local_48._M_local_buf[6]);
      auVar8[7] = -(local_78.field_2._M_local_buf[7] == local_48._M_local_buf[7]);
      auVar8[8] = -(local_78.field_2._M_local_buf[8] == local_48._M_local_buf[8]);
      auVar8[9] = -(local_78.field_2._M_local_buf[9] == local_48._M_local_buf[9]);
      auVar8[10] = -(local_78.field_2._M_local_buf[10] == local_48._M_local_buf[10]);
      auVar8[0xb] = -(local_78.field_2._M_local_buf[0xb] == local_48._M_local_buf[0xb]);
      auVar8[0xc] = -(local_78.field_2._M_local_buf[0xc] == local_48._M_local_buf[0xc]);
      auVar8[0xd] = -(local_78.field_2._M_local_buf[0xd] == local_48._M_local_buf[0xd]);
      auVar8[0xe] = -(local_78.field_2._M_local_buf[0xe] == local_48._M_local_buf[0xe]);
      auVar8[0xf] = -(local_78.field_2._M_local_buf[0xf] == local_48._M_local_buf[0xf]);
      auVar7[0] = -((char)local_78._M_dataplus._M_p == local_58[0]);
      auVar7[1] = -(local_78._M_dataplus._M_p._1_1_ == local_58[1]);
      auVar7[2] = -(local_78._M_dataplus._M_p._2_1_ == local_58[2]);
      auVar7[3] = -(local_78._M_dataplus._M_p._3_1_ == local_58[3]);
      auVar7[4] = -(local_78._M_dataplus._M_p._4_1_ == local_58[4]);
      auVar7[5] = -(local_78._M_dataplus._M_p._5_1_ == local_58[5]);
      auVar7[6] = -(local_78._M_dataplus._M_p._6_1_ == local_58[6]);
      auVar7[7] = -(local_78._M_dataplus._M_p._7_1_ == local_58[7]);
      auVar7[8] = -((char)local_78._M_string_length == local_58[8]);
      auVar7[9] = -(local_78._M_string_length._1_1_ == local_58[9]);
      auVar7[10] = -(local_78._M_string_length._2_1_ == local_58[10]);
      auVar7[0xb] = -(local_78._M_string_length._3_1_ == local_58[0xb]);
      auVar7[0xc] = -(local_78._M_string_length._4_1_ == local_58[0xc]);
      auVar7[0xd] = -(local_78._M_string_length._5_1_ == local_58[0xd]);
      auVar7[0xe] = -(local_78._M_string_length._6_1_ == local_58[0xe]);
      auVar7[0xf] = -(local_78._M_string_length._7_1_ == local_58[0xf]);
      auVar7 = auVar7 & auVar8;
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
        AutoFile::~AutoFile((AutoFile *)local_98);
        local_188[0] = ((long)(__return_storage_ptr__->
                              super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(__return_storage_ptr__->
                              super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                              super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        fs::path::filename((path *)&local_148,anchors_db_path);
        local_168[0] = local_158;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,local_148.super_HashWriter.ctx.s._0_8_,
                   local_148.super_HashWriter.ctx.s._0_8_ + local_148.super_HashWriter.ctx.s._8_8_);
        local_170 = 0x2622;
        local_178 = (string *)local_168;
        pLVar4 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar4);
        if (bVar2) {
          local_58._8_8_ = 0;
          local_58._0_8_ = (SerParams *)(local_58 + 0x10);
          auVar1[0xf] = 0;
          auVar1._0_15_ = local_48._1_15_;
          local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )(auVar1 << 8);
          tinyformat::
          format<unsigned_long,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                    (&local_78,(tinyformat *)"Loaded %i addresses from %s\n",(char *)local_188,
                     (unsigned_long *)&local_178,in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,
                            CONCAT17(local_78.field_2._M_local_buf[7],
                                     CONCAT16(local_78.field_2._M_local_buf[6],
                                              CONCAT15(local_78.field_2._M_local_buf[5],
                                                       CONCAT14(local_78.field_2._M_local_buf[4],
                                                                CONCAT13(local_78.field_2.
                                                                         _M_local_buf[3],
                                                                         CONCAT12(local_78.field_2.
                                                                                  _M_local_buf[2],
                                                                                  CONCAT11(local_78.
                                                  field_2._M_local_buf[1],
                                                  local_78.field_2._M_local_buf[0]))))))) + 1);
          }
          pLVar4 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x53;
          local_78._M_string_length = 0xfba09c;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp"
          ;
          source_file._M_len = 0x53;
          str._M_str = (char *)local_58._0_8_;
          str._M_len = local_58._8_8_;
          logging_function._M_str = "ReadAnchors";
          logging_function._M_len = 0xb;
          BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0xea,ALL,Info);
          if ((SerParams *)local_58._0_8_ != (SerParams *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
          }
        }
        if (local_168[0] != local_158) {
          operator_delete(local_168[0],local_158[0] + 1);
        }
        std::filesystem::__cxx11::path::~path((path *)&local_148);
        std::filesystem::remove((path *)anchors_db_path);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
        goto LAB_00855cca;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Checksum mismatch, data corrupted");
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid network magic number");
    }
    pcVar5 = std::runtime_error::~runtime_error;
    ppuVar6 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(this,ppuVar6,pcVar5);
  }
LAB_00855cca:
  __stack_chk_fail();
}

Assistant:

std::vector<CAddress> ReadAnchors(const fs::path& anchors_db_path)
{
    std::vector<CAddress> anchors;
    try {
        DeserializeFileDB(anchors_db_path, CAddress::V2_DISK(anchors));
        LogPrintf("Loaded %i addresses from %s\n", anchors.size(), fs::quoted(fs::PathToString(anchors_db_path.filename())));
    } catch (const std::exception&) {
        anchors.clear();
    }

    fs::remove(anchors_db_path);
    return anchors;
}